

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O1

bool __thiscall
draco::AttributeQuantizationTransform::InverseTransformAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute,
          PointAttribute *target_attribute)

{
  byte bVar1;
  int32_t iVar2;
  pointer pfVar3;
  bool bVar4;
  void *__src;
  undefined7 extraout_var;
  ulong uVar5;
  ValueType VVar6;
  int iVar7;
  long lVar8;
  Dequantizer dequantizer;
  Dequantizer local_5c;
  undefined4 local_58;
  ValueType local_54;
  PointAttribute *local_50;
  long local_48;
  AttributeQuantizationTransform *local_40;
  ulong local_38;
  
  if ((target_attribute->super_GeometryAttribute).data_type_ == DT_FLOAT32) {
    iVar2 = this->quantization_bits_;
    bVar1 = (target_attribute->super_GeometryAttribute).num_components_;
    local_38 = (ulong)((uint)bVar1 * 4);
    local_50 = target_attribute;
    __src = operator_new__(local_38);
    Dequantizer::Dequantizer(&local_5c);
    bVar4 = Dequantizer::Init(&local_5c,this->range_,~(-1 << ((byte)iVar2 & 0x1f)));
    local_58 = (undefined4)CONCAT71(extraout_var,bVar4);
    local_40 = this;
    if ((bVar4) && (local_54 = local_50->num_unique_entries_, local_54 != 0)) {
      local_48 = (attribute->super_GeometryAttribute).byte_offset_ +
                 (long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      lVar8 = 0;
      VVar6 = 0;
      iVar7 = 0;
      do {
        if ((ulong)bVar1 != 0) {
          pfVar3 = (local_40->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar5 = 0;
          do {
            *(float *)((long)__src + uVar5 * 4) =
                 (float)*(int *)(local_48 + (long)iVar7 * 4 + uVar5 * 4) * local_5c.delta_ +
                 pfVar3[uVar5];
            uVar5 = uVar5 + 1;
          } while (bVar1 != uVar5);
          iVar7 = iVar7 + (int)uVar5;
        }
        memcpy((void *)(*(long *)&(((local_50->attribute_buffer_)._M_t.
                                    super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                    .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl)
                                  ->data_).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       + lVar8),__src,local_38);
        lVar8 = lVar8 + (ulong)((uint)bVar1 * 4);
        VVar6 = VVar6 + 1;
      } while (VVar6 != local_54);
    }
    operator_delete__(__src);
  }
  else {
    local_58 = 0;
  }
  return SUB41(local_58,0);
}

Assistant:

bool AttributeQuantizationTransform::InverseTransformAttribute(
    const PointAttribute &attribute, PointAttribute *target_attribute) {
  if (target_attribute->data_type() != DT_FLOAT32) {
    return false;
  }

  // Convert all quantized values back to floats.
  const int32_t max_quantized_value =
      (1u << static_cast<uint32_t>(quantization_bits_)) - 1;
  const int num_components = target_attribute->num_components();
  const int entry_size = sizeof(float) * num_components;
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  int quant_val_id = 0;
  int out_byte_pos = 0;
  Dequantizer dequantizer;
  if (!dequantizer.Init(range_, max_quantized_value)) {
    return false;
  }
  const int32_t *const source_attribute_data =
      reinterpret_cast<const int32_t *>(
          attribute.GetAddress(AttributeValueIndex(0)));

  const int num_values = target_attribute->size();

  for (uint32_t i = 0; i < num_values; ++i) {
    for (int c = 0; c < num_components; ++c) {
      float value =
          dequantizer.DequantizeFloat(source_attribute_data[quant_val_id++]);
      value = value + min_values_[c];
      att_val[c] = value;
    }
    // Store the floating point value into the attribute buffer.
    target_attribute->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
    out_byte_pos += entry_size;
  }
  return true;
}